

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgnometheme.cpp
# Opt level: O0

QIcon __thiscall QGnomeTheme::fileIcon(QGnomeTheme *this,QFileInfo *fileInfo,IconOptions param_3)

{
  QIconPrivate *in_RDI;
  QFileInfo *unaff_retaddr;
  
  QGenericUnixTheme::xdgFileIcon(unaff_retaddr);
  return (QIcon)in_RDI;
}

Assistant:

QIcon QGnomeTheme::fileIcon(const QFileInfo &fileInfo, QPlatformTheme::IconOptions) const
{
#if QT_CONFIG(mimetype)
    return xdgFileIcon(fileInfo);
#else
    Q_UNUSED(fileInfo);
    return QIcon();
#endif
}